

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# policy.cc
# Opt level: O0

int apply_skip_certs(ASN1_INTEGER *skip_certs,size_t *value)

{
  int iVar1;
  ulong local_28;
  uint64_t u64;
  size_t *value_local;
  ASN1_INTEGER *skip_certs_local;
  
  if (skip_certs == (ASN1_INTEGER *)0x0) {
    skip_certs_local._4_4_ = 1;
  }
  else {
    u64 = (uint64_t)value;
    value_local = (size_t *)skip_certs;
    if ((skip_certs->type & 0x100U) == 0) {
      iVar1 = ASN1_INTEGER_get_uint64(&local_28,skip_certs);
      if ((iVar1 != 0) && (local_28 < *(ulong *)u64)) {
        *(ulong *)u64 = local_28;
      }
      ERR_clear_error();
      skip_certs_local._4_4_ = 1;
    }
    else {
      ERR_put_error(0xb,0,0x90,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/policy.cc"
                    ,0x210);
      skip_certs_local._4_4_ = 0;
    }
  }
  return skip_certs_local._4_4_;
}

Assistant:

static int apply_skip_certs(const ASN1_INTEGER *skip_certs, size_t *value) {
  if (skip_certs == NULL) {
    return 1;
  }

  // TODO(https://crbug.com/boringssl/443): Move this check into the parser.
  if (skip_certs->type & V_ASN1_NEG) {
    OPENSSL_PUT_ERROR(X509, X509_R_INVALID_POLICY_EXTENSION);
    return 0;
  }

  // If |skip_certs| does not fit in |uint64_t|, it must exceed |*value|.
  uint64_t u64;
  if (ASN1_INTEGER_get_uint64(&u64, skip_certs) && u64 < *value) {
    *value = (size_t)u64;
  }
  ERR_clear_error();
  return 1;
}